

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O0

void __thiscall Diligent::VulkanDynamicMemoryManager::Destroy(VulkanDynamicMemoryManager *this)

{
  VkBuffer_T *pVVar1;
  VulkanLogicalDevice *this_00;
  VkDeviceMemory_T *memory;
  VulkanDynamicMemoryManager *this_local;
  
  pVVar1 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)&this->m_VkBuffer);
  if (pVVar1 != (VkBuffer_T *)0x0) {
    this_00 = RenderDeviceVkImpl::GetLogicalDevice(this->m_DeviceVk);
    memory = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDeviceMemory_T_
                       ((VulkanObjectWrapper *)&this->m_BufferMemory);
    VulkanUtilities::VulkanLogicalDevice::UnmapMemory(this_00,memory);
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)this->m_DeviceVk,&this->m_VkBuffer,this->m_CommandQueueMask);
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)this->m_DeviceVk,&this->m_BufferMemory,this->m_CommandQueueMask);
  }
  this->m_CPUAddress = (Uint8 *)0x0;
  return;
}

Assistant:

void VulkanDynamicMemoryManager::Destroy()
{
    if (m_VkBuffer)
    {
        m_DeviceVk.GetLogicalDevice().UnmapMemory(m_BufferMemory);
        m_DeviceVk.SafeReleaseDeviceObject(std::move(m_VkBuffer), m_CommandQueueMask);
        m_DeviceVk.SafeReleaseDeviceObject(std::move(m_BufferMemory), m_CommandQueueMask);
    }
    m_CPUAddress = nullptr;
}